

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperplane.cpp
# Opt level: O1

void hyperplane_dimension_order(double *angle_values,int *dims,int ndims,int *dimension_order)

{
  int *__last;
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  long lVar7;
  ulong uVar8;
  int *piVar9;
  int *__i;
  int *__last_00;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_viennamapping[P]mpicartreorderlib_src_reordering_algorithms_hyperplane_hyperplane_cpp:49:4)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_viennamapping[P]mpicartreorderlib_src_reordering_algorithms_hyperplane_hyperplane_cpp:49:4)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_viennamapping[P]mpicartreorderlib_src_reordering_algorithms_hyperplane_hyperplane_cpp:49:4)>
  __comp_01;
  int *local_38;
  double *local_30;
  
  auVar6 = _DAT_00156010;
  if (0 < ndims) {
    lVar7 = (ulong)(uint)ndims - 1;
    auVar10._8_4_ = (int)lVar7;
    auVar10._0_8_ = lVar7;
    auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar8 = 0;
    auVar10 = auVar10 ^ _DAT_00156010;
    auVar11 = _DAT_00156000;
    do {
      auVar12 = auVar11 ^ auVar6;
      if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                  auVar10._4_4_ < auVar12._4_4_) & 1)) {
        dimension_order[uVar8] = (int)uVar8;
      }
      if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
          auVar12._12_4_ <= auVar10._12_4_) {
        dimension_order[uVar8 + 1] = (int)uVar8 + 1;
      }
      uVar8 = uVar8 + 2;
      lVar7 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar7 + 2;
    } while ((ndims + 1U & 0xfffffffe) != uVar8);
  }
  if (ndims != 0) {
    uVar8 = (ulong)ndims;
    __last = dimension_order + uVar8;
    lVar7 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    __comp._M_comp.dims = &local_38;
    __comp._M_comp.angle_values = &local_30;
    local_38 = dims;
    local_30 = angle_values;
    std::
    __introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<hyperplane_dimension_order(double_const*,int_const*,int,int*)::__0>>
              (dimension_order,__last,(ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e,__comp);
    if (ndims < 0x11) {
      __comp_01._M_comp.dims = &local_38;
      __comp_01._M_comp.angle_values = &local_30;
      std::
      __insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<hyperplane_dimension_order(double_const*,int_const*,int,int*)::__0>>
                (dimension_order,__last,__comp_01);
    }
    else {
      __last_00 = dimension_order + 0x10;
      __comp_00._M_comp.dims = &local_38;
      __comp_00._M_comp.angle_values = &local_30;
      std::
      __insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<hyperplane_dimension_order(double_const*,int_const*,int,int*)::__0>>
                (dimension_order,__last_00,__comp_00);
      do {
        iVar3 = *__last_00;
        dVar1 = angle_values[iVar3];
        piVar9 = __last_00;
        while( true ) {
          iVar4 = piVar9[-1];
          dVar2 = angle_values[iVar4];
          if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
            bVar5 = dVar1 < dVar2;
          }
          else {
            bVar5 = dims[iVar4] < dims[iVar3];
          }
          if (!bVar5) break;
          *piVar9 = iVar4;
          piVar9 = piVar9 + -1;
        }
        *piVar9 = iVar3;
        __last_00 = __last_00 + 1;
      } while (__last_00 != __last);
    }
  }
  return;
}

Assistant:

void hyperplane_dimension_order(const double angle_values[],
				const int dims[],
				const int ndims,
				int dimension_order[]) {
  //O(n)
  for (int i = 0; i < ndims; i++) {
	dimension_order[i] = i;
  }

  // O ( ndims log (ndims) )
  //Sort the dimension_order vector based on the values in angle_values
  std::sort(&dimension_order[0], &dimension_order[0] + ndims,
			[&](const int &j, const int &k) {
			  if (angle_values[j] == angle_values[k])
				return dims[j] > dims[k];
			  else
				return angle_values[j] < angle_values[k];
			}
  );
}